

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O1

void aom_highbd_lpf_vertical_6_dual_sse2
               (uint16_t *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1,int bd)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  uint16_t uVar53;
  uint16_t uVar54;
  uint16_t uVar55;
  uint16_t uVar56;
  uint16_t uVar57;
  uint16_t uVar58;
  uint16_t uVar59;
  uint16_t uVar60;
  uint16_t uVar61;
  uint16_t uVar62;
  uint16_t uVar63;
  uint16_t uVar64;
  uint16_t uVar65;
  uint16_t uVar66;
  uint16_t uVar67;
  uint16_t uVar68;
  uint16_t uVar69;
  uint16_t uVar70;
  uint16_t uVar71;
  uint16_t uVar72;
  undefined1 auVar73 [12];
  undefined1 auVar74 [12];
  undefined1 auVar75 [12];
  undefined1 auVar76 [12];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  short sVar97;
  undefined4 uVar98;
  undefined8 uVar99;
  short sVar105;
  short sVar107;
  short sVar109;
  short sVar111;
  undefined1 auVar100 [16];
  short sVar104;
  short sVar106;
  short sVar108;
  short sVar110;
  short sVar112;
  undefined1 auVar101 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  short sVar118;
  ushort uVar119;
  short sVar120;
  short sVar123;
  ushort uVar125;
  short sVar126;
  ushort uVar128;
  ushort uVar129;
  ushort uVar130;
  undefined1 auVar121 [16];
  ushort uVar124;
  ushort uVar127;
  ushort uVar131;
  short sVar132;
  undefined1 auVar122 [16];
  short sVar133;
  short sVar141;
  short sVar142;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  short sVar143;
  short sVar147;
  short sVar148;
  short sVar149;
  short sVar150;
  short sVar151;
  short sVar152;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  short sVar153;
  short sVar154;
  short sVar155;
  undefined1 auVar156 [12];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  short sVar165;
  short sVar166;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  ushort uVar167;
  ushort uVar172;
  ushort uVar173;
  ushort uVar174;
  short sVar175;
  short sVar177;
  ushort uVar179;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  ushort uVar176;
  ushort uVar178;
  ushort uVar180;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  ushort uVar181;
  undefined4 uVar182;
  ushort uVar191;
  ushort uVar192;
  ushort uVar193;
  ushort uVar194;
  ushort uVar195;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  ushort uVar190;
  ushort uVar196;
  undefined1 auVar188 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  short sVar200;
  short sVar209;
  short sVar210;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  short sVar211;
  short sVar220;
  short sVar221;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  ushort uVar222;
  ushort uVar225;
  ushort uVar226;
  ushort uVar227;
  ushort uVar228;
  ushort uVar229;
  ushort uVar230;
  undefined1 auVar223 [16];
  ushort uVar231;
  undefined1 auVar224 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar160 [16];
  undefined1 auVar183 [12];
  undefined1 auVar189 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  
  auVar113 = *(undefined1 (*) [16])(s + -3);
  puVar1 = s + (long)p + -3;
  uVar53 = *puVar1;
  uVar54 = puVar1[1];
  uVar55 = puVar1[3];
  uVar56 = puVar1[4];
  uVar57 = puVar1[5];
  auVar117 = *(undefined1 (*) [16])(s + (long)(p * 2) + -3);
  puVar2 = s + (long)(p * 3) + -3;
  uVar58 = *puVar2;
  uVar59 = puVar2[1];
  uVar60 = puVar2[3];
  uVar61 = puVar2[4];
  uVar62 = puVar2[5];
  auVar122 = *(undefined1 (*) [16])(s + (long)(p * 4) + -3);
  puVar3 = s + (long)(p * 5) + -3;
  uVar63 = *puVar3;
  uVar64 = puVar3[1];
  uVar65 = puVar3[3];
  uVar66 = puVar3[4];
  uVar67 = puVar3[5];
  auVar140 = *(undefined1 (*) [16])(s + (long)(p * 6) + -3);
  auVar100 = *(undefined1 (*) [16])_blimit0;
  puVar4 = s + (long)(p * 7) + -3;
  uVar68 = *puVar4;
  uVar69 = puVar4[1];
  uVar70 = puVar4[3];
  uVar71 = puVar4[4];
  uVar72 = puVar4[5];
  sVar142 = auVar113._6_2_;
  auVar137._0_12_ = auVar113._0_12_;
  auVar137._12_2_ = sVar142;
  auVar137._14_2_ = uVar55;
  auVar136._12_4_ = auVar137._12_4_;
  auVar136._0_10_ = auVar113._0_10_;
  auVar136._10_2_ = puVar1[2];
  auVar135._10_6_ = auVar136._10_6_;
  auVar135._0_8_ = auVar113._0_8_;
  auVar135._8_2_ = auVar113._4_2_;
  auVar73._4_8_ = auVar135._8_8_;
  auVar73._2_2_ = uVar54;
  sVar141 = auVar113._2_2_;
  auVar73._0_2_ = sVar141;
  sVar133 = auVar113._0_2_;
  auVar134._0_4_ = CONCAT22(uVar53,sVar133);
  auVar134._4_12_ = auVar73;
  sVar126 = auVar117._6_2_;
  auVar185._0_12_ = auVar117._0_12_;
  auVar185._12_2_ = sVar126;
  auVar185._14_2_ = uVar60;
  auVar169._12_4_ = auVar185._12_4_;
  auVar169._0_10_ = auVar117._0_10_;
  auVar169._10_2_ = puVar2[2];
  auVar145._10_6_ = auVar169._10_6_;
  auVar145._0_8_ = auVar117._0_8_;
  auVar145._8_2_ = auVar117._4_2_;
  auVar74._4_8_ = auVar145._8_8_;
  auVar74._2_2_ = uVar59;
  sVar123 = auVar117._2_2_;
  auVar74._0_2_ = sVar123;
  sVar118 = auVar117._0_2_;
  auVar197._6_2_ = uVar58;
  auVar197._4_2_ = sVar118;
  sVar210 = auVar122._6_2_;
  auVar204._0_12_ = auVar122._0_12_;
  auVar204._12_2_ = sVar210;
  auVar204._14_2_ = uVar65;
  auVar203._12_4_ = auVar204._12_4_;
  auVar203._0_10_ = auVar122._0_10_;
  auVar203._10_2_ = puVar3[2];
  auVar202._10_6_ = auVar203._10_6_;
  auVar202._0_8_ = auVar122._0_8_;
  auVar202._8_2_ = auVar122._4_2_;
  auVar75._4_8_ = auVar202._8_8_;
  auVar75._2_2_ = uVar64;
  sVar209 = auVar122._2_2_;
  auVar75._0_2_ = sVar209;
  sVar200 = auVar122._0_2_;
  auVar201._0_4_ = CONCAT22(uVar63,sVar200);
  auVar201._4_12_ = auVar75;
  sVar221 = auVar140._6_2_;
  auVar214._0_12_ = auVar140._0_12_;
  auVar214._12_2_ = sVar221;
  auVar214._14_2_ = uVar70;
  auVar213._12_4_ = auVar214._12_4_;
  auVar213._0_10_ = auVar140._0_10_;
  auVar213._10_2_ = puVar4[2];
  auVar212._10_6_ = auVar213._10_6_;
  auVar212._0_8_ = auVar140._0_8_;
  auVar212._8_2_ = auVar140._4_2_;
  auVar76._4_8_ = auVar212._8_8_;
  auVar76._2_2_ = uVar69;
  sVar220 = auVar140._2_2_;
  auVar76._0_2_ = sVar220;
  sVar211 = auVar140._0_2_;
  auVar197._14_2_ = uVar68;
  auVar197._12_2_ = sVar211;
  auVar121._0_8_ = auVar134._0_8_;
  auVar121._8_4_ = auVar73._0_4_;
  auVar121._12_4_ = auVar74._0_4_;
  auVar197._0_4_ = auVar134._0_4_;
  auVar157._0_8_ = auVar201._0_8_;
  auVar157._8_4_ = auVar75._0_4_;
  auVar157._12_4_ = auVar76._0_4_;
  auVar197._8_4_ = auVar201._0_4_;
  auVar163._8_8_ = auVar157._8_8_;
  auVar163._0_8_ = auVar121._8_8_;
  auVar138._0_8_ = CONCAT44(auVar145._8_4_,auVar135._8_4_);
  auVar138._8_4_ = auVar136._12_4_;
  auVar138._12_4_ = auVar169._12_4_;
  auVar121 = *(undefined1 (*) [16])_blimit1;
  auVar184 = ZEXT416(bd - 8);
  auVar205._0_8_ = CONCAT44(auVar212._8_4_,auVar202._8_4_);
  auVar205._8_4_ = auVar203._12_4_;
  auVar205._12_4_ = auVar213._12_4_;
  auVar208._8_8_ = auVar205._0_8_;
  auVar208._0_8_ = auVar138._0_8_;
  auVar139._8_8_ = auVar205._8_8_;
  auVar139._0_8_ = auVar138._8_8_;
  auVar185 = *(undefined1 (*) [16])_limit0;
  sVar165 = auVar113._8_2_;
  sVar166 = auVar113._10_2_;
  auVar161._0_8_ = CONCAT26(uVar57,CONCAT24(sVar166,CONCAT22(uVar56,sVar165)));
  auVar145 = *(undefined1 (*) [16])_limit1;
  sVar154 = auVar117._8_2_;
  sVar155 = auVar117._10_2_;
  auVar169 = *(undefined1 (*) [16])_thresh0;
  auVar161._8_4_ = (int)((ulong)auVar161._0_8_ >> 0x20);
  auVar161._12_4_ = (int)(CONCAT26(uVar62,CONCAT24(sVar155,CONCAT22(uVar61,sVar154))) >> 0x20);
  auVar144._4_4_ = CONCAT22(uVar61,sVar154);
  auVar144._0_4_ = CONCAT22(uVar56,sVar165);
  sVar175 = auVar122._8_2_;
  sVar177 = auVar122._10_2_;
  auVar168._0_8_ = CONCAT26(uVar67,CONCAT24(sVar177,CONCAT22(uVar66,sVar175)));
  sVar107 = auVar140._8_2_;
  sVar109 = auVar140._10_2_;
  auVar168._8_4_ = (int)((ulong)auVar168._0_8_ >> 0x20);
  auVar168._12_4_ = (int)(CONCAT26(uVar72,CONCAT24(sVar109,CONCAT22(uVar71,sVar107))) >> 0x20);
  auVar144._12_4_ = CONCAT22(uVar71,sVar107);
  auVar144._8_4_ = CONCAT22(uVar66,sVar175);
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar100._0_13_;
  auVar5[0xe] = auVar100[7];
  auVar11[0xc] = auVar100[6];
  auVar11._0_12_ = auVar100._0_12_;
  auVar11._13_2_ = auVar5._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar100._0_11_;
  auVar17._12_3_ = auVar11._12_3_;
  auVar23[10] = auVar100[5];
  auVar23._0_10_ = auVar100._0_10_;
  auVar23._11_4_ = auVar17._11_4_;
  auVar29[9] = 0;
  auVar29._0_9_ = auVar100._0_9_;
  auVar29._10_5_ = auVar23._10_5_;
  auVar35[8] = auVar100[4];
  auVar35._0_8_ = auVar100._0_8_;
  auVar35._9_6_ = auVar29._9_6_;
  auVar77._7_8_ = 0;
  auVar77._0_7_ = auVar35._8_7_;
  auVar85._1_8_ = SUB158(auVar77 << 0x40,7);
  auVar85[0] = auVar100[3];
  auVar85._9_6_ = 0;
  auVar86._1_10_ = SUB1510(auVar85 << 0x30,5);
  auVar86[0] = auVar100[2];
  auVar86._11_4_ = 0;
  auVar41[2] = auVar100[1];
  auVar41._0_2_ = auVar100._0_2_;
  auVar41._3_12_ = SUB1512(auVar86 << 0x20,3);
  auVar47._2_13_ = auVar41._2_13_;
  auVar47._0_2_ = auVar100._0_2_ & 0xff;
  auVar6[0xd] = 0;
  auVar6._0_13_ = auVar121._0_13_;
  auVar6[0xe] = auVar121[7];
  auVar12[0xc] = auVar121[6];
  auVar12._0_12_ = auVar121._0_12_;
  auVar12._13_2_ = auVar6._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar121._0_11_;
  auVar18._12_3_ = auVar12._12_3_;
  auVar24[10] = auVar121[5];
  auVar24._0_10_ = auVar121._0_10_;
  auVar24._11_4_ = auVar18._11_4_;
  auVar30[9] = 0;
  auVar30._0_9_ = auVar121._0_9_;
  auVar30._10_5_ = auVar24._10_5_;
  auVar36[8] = auVar121[4];
  auVar36._0_8_ = auVar121._0_8_;
  auVar36._9_6_ = auVar30._9_6_;
  auVar78._7_8_ = 0;
  auVar78._0_7_ = auVar36._8_7_;
  auVar87._1_8_ = SUB158(auVar78 << 0x40,7);
  auVar87[0] = auVar121[3];
  auVar87._9_6_ = 0;
  auVar88._1_10_ = SUB1510(auVar87 << 0x30,5);
  auVar88[0] = auVar121[2];
  auVar88._11_4_ = 0;
  auVar42[2] = auVar121[1];
  auVar42._0_2_ = auVar121._0_2_;
  auVar42._3_12_ = SUB1512(auVar88 << 0x20,3);
  auVar48._2_13_ = auVar42._2_13_;
  auVar48._0_2_ = auVar121._0_2_ & 0xff;
  auVar198._0_8_ = auVar47._0_8_;
  auVar198._8_8_ = auVar48._0_8_;
  auVar199 = psllw(auVar198,auVar184);
  auVar162._8_8_ = auVar168._8_8_;
  auVar162._0_8_ = auVar161._8_8_;
  auVar7[0xd] = 0;
  auVar7._0_13_ = auVar185._0_13_;
  auVar7[0xe] = auVar185[7];
  auVar13[0xc] = auVar185[6];
  auVar13._0_12_ = auVar185._0_12_;
  auVar13._13_2_ = auVar7._13_2_;
  auVar19[0xb] = 0;
  auVar19._0_11_ = auVar185._0_11_;
  auVar19._12_3_ = auVar13._12_3_;
  auVar25[10] = auVar185[5];
  auVar25._0_10_ = auVar185._0_10_;
  auVar25._11_4_ = auVar19._11_4_;
  auVar31[9] = 0;
  auVar31._0_9_ = auVar185._0_9_;
  auVar31._10_5_ = auVar25._10_5_;
  auVar37[8] = auVar185[4];
  auVar37._0_8_ = auVar185._0_8_;
  auVar37._9_6_ = auVar31._9_6_;
  auVar79._7_8_ = 0;
  auVar79._0_7_ = auVar37._8_7_;
  auVar89._1_8_ = SUB158(auVar79 << 0x40,7);
  auVar89[0] = auVar185[3];
  auVar89._9_6_ = 0;
  auVar90._1_10_ = SUB1510(auVar89 << 0x30,5);
  auVar90[0] = auVar185[2];
  auVar90._11_4_ = 0;
  auVar43[2] = auVar185[1];
  auVar43._0_2_ = auVar185._0_2_;
  auVar43._3_12_ = SUB1512(auVar90 << 0x20,3);
  auVar49._2_13_ = auVar43._2_13_;
  auVar49._0_2_ = auVar185._0_2_ & 0xff;
  auVar8[0xd] = 0;
  auVar8._0_13_ = auVar145._0_13_;
  auVar8[0xe] = auVar145[7];
  auVar14[0xc] = auVar145[6];
  auVar14._0_12_ = auVar145._0_12_;
  auVar14._13_2_ = auVar8._13_2_;
  auVar20[0xb] = 0;
  auVar20._0_11_ = auVar145._0_11_;
  auVar20._12_3_ = auVar14._12_3_;
  auVar26[10] = auVar145[5];
  auVar26._0_10_ = auVar145._0_10_;
  auVar26._11_4_ = auVar20._11_4_;
  auVar32[9] = 0;
  auVar32._0_9_ = auVar145._0_9_;
  auVar32._10_5_ = auVar26._10_5_;
  auVar38[8] = auVar145[4];
  auVar38._0_8_ = auVar145._0_8_;
  auVar38._9_6_ = auVar32._9_6_;
  auVar80._7_8_ = 0;
  auVar80._0_7_ = auVar38._8_7_;
  auVar91._1_8_ = SUB158(auVar80 << 0x40,7);
  auVar91[0] = auVar145[3];
  auVar91._9_6_ = 0;
  auVar92._1_10_ = SUB1510(auVar91 << 0x30,5);
  auVar92[0] = auVar145[2];
  auVar92._11_4_ = 0;
  auVar44[2] = auVar145[1];
  auVar44._0_2_ = auVar145._0_2_;
  auVar44._3_12_ = SUB1512(auVar92 << 0x20,3);
  auVar50._2_13_ = auVar44._2_13_;
  auVar50._0_2_ = auVar145._0_2_ & 0xff;
  auVar206._0_8_ = auVar49._0_8_;
  auVar206._8_8_ = auVar50._0_8_;
  auVar207 = psllw(auVar206,auVar184);
  auVar9[0xd] = 0;
  auVar9._0_13_ = auVar169._0_13_;
  auVar9[0xe] = auVar169[7];
  auVar15[0xc] = auVar169[6];
  auVar15._0_12_ = auVar169._0_12_;
  auVar15._13_2_ = auVar9._13_2_;
  auVar21[0xb] = 0;
  auVar21._0_11_ = auVar169._0_11_;
  auVar21._12_3_ = auVar15._12_3_;
  auVar27[10] = auVar169[5];
  auVar27._0_10_ = auVar169._0_10_;
  auVar27._11_4_ = auVar21._11_4_;
  auVar33[9] = 0;
  auVar33._0_9_ = auVar169._0_9_;
  auVar33._10_5_ = auVar27._10_5_;
  auVar39[8] = auVar169[4];
  auVar39._0_8_ = auVar169._0_8_;
  auVar39._9_6_ = auVar33._9_6_;
  auVar81._7_8_ = 0;
  auVar81._0_7_ = auVar39._8_7_;
  auVar93._1_8_ = SUB158(auVar81 << 0x40,7);
  auVar93[0] = auVar169[3];
  auVar93._9_6_ = 0;
  auVar94._1_10_ = SUB1510(auVar93 << 0x30,5);
  auVar94[0] = auVar169[2];
  auVar94._11_4_ = 0;
  auVar45[2] = auVar169[1];
  auVar45._0_2_ = auVar169._0_2_;
  auVar45._3_12_ = SUB1512(auVar94 << 0x20,3);
  auVar51._2_13_ = auVar45._2_13_;
  auVar51._0_2_ = auVar169._0_2_ & 0xff;
  auVar100 = *(undefined1 (*) [16])_thresh1;
  auVar10[0xd] = 0;
  auVar10._0_13_ = auVar100._0_13_;
  auVar10[0xe] = auVar100[7];
  auVar16[0xc] = auVar100[6];
  auVar16._0_12_ = auVar100._0_12_;
  auVar16._13_2_ = auVar10._13_2_;
  auVar22[0xb] = 0;
  auVar22._0_11_ = auVar100._0_11_;
  auVar22._12_3_ = auVar16._12_3_;
  auVar28[10] = auVar100[5];
  auVar28._0_10_ = auVar100._0_10_;
  auVar28._11_4_ = auVar22._11_4_;
  auVar34[9] = 0;
  auVar34._0_9_ = auVar100._0_9_;
  auVar34._10_5_ = auVar28._10_5_;
  auVar40[8] = auVar100[4];
  auVar40._0_8_ = auVar100._0_8_;
  auVar40._9_6_ = auVar34._9_6_;
  auVar82._7_8_ = 0;
  auVar82._0_7_ = auVar40._8_7_;
  auVar95._1_8_ = SUB158(auVar82 << 0x40,7);
  auVar95[0] = auVar100[3];
  auVar95._9_6_ = 0;
  auVar96._1_10_ = SUB1510(auVar95 << 0x30,5);
  auVar96[0] = auVar100[2];
  auVar96._11_4_ = 0;
  auVar46[2] = auVar100[1];
  auVar46._0_2_ = auVar100._0_2_;
  auVar46._3_12_ = SUB1512(auVar96 << 0x20,3);
  auVar52._2_13_ = auVar46._2_13_;
  auVar52._0_2_ = auVar100._0_2_ & 0xff;
  auVar158._0_8_ = auVar51._0_8_;
  auVar158._8_8_ = auVar52._0_8_;
  auVar100 = psubusw(auVar197,auVar163);
  auVar169 = psubusw(auVar163,auVar197);
  auVar169 = auVar169 | auVar100;
  auVar100 = psubusw(auVar163,auVar208);
  auVar121 = psubusw(auVar208,auVar163);
  auVar121 = auVar121 | auVar100;
  auVar100 = psubusw(auVar144,auVar139);
  auVar185 = psubusw(auVar139,auVar144);
  auVar185 = auVar185 | auVar100;
  sVar97 = auVar121._0_2_;
  sVar104 = auVar185._0_2_;
  auVar186._0_2_ = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar121._2_2_;
  sVar104 = auVar185._2_2_;
  auVar186._2_2_ = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar121._4_2_;
  sVar104 = auVar185._4_2_;
  auVar186._4_2_ = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar121._6_2_;
  sVar104 = auVar185._6_2_;
  auVar186._6_2_ = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar121._8_2_;
  sVar104 = auVar185._8_2_;
  auVar186._8_2_ = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar121._10_2_;
  sVar104 = auVar185._10_2_;
  auVar186._10_2_ = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar121._12_2_;
  sVar104 = auVar185._12_2_;
  sVar105 = auVar185._14_2_;
  auVar186._12_2_ = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar121._14_2_;
  auVar186._14_2_ = (ushort)(sVar105 < sVar97) * sVar97 | (ushort)(sVar105 >= sVar97) * sVar105;
  auVar121 = psubusw(auVar162,auVar144);
  auVar100 = psubusw(auVar144,auVar162);
  auVar100 = auVar100 | auVar121;
  auVar121 = psubusw(auVar208,auVar139);
  auVar145 = psubusw(auVar139,auVar208);
  auVar185 = psubusw(auVar163,auVar144);
  auVar215 = psubusw(auVar144,auVar163);
  auVar215 = auVar215 | auVar185;
  auVar121 = paddusw(auVar145 | auVar121,auVar145 | auVar121);
  auVar216._0_2_ = auVar215._0_2_ >> 1;
  auVar216._2_2_ = auVar215._2_2_ >> 1;
  auVar216._4_2_ = auVar215._4_2_ >> 1;
  auVar216._6_2_ = auVar215._6_2_ >> 1;
  auVar216._8_2_ = auVar215._8_2_ >> 1;
  auVar216._10_2_ = auVar215._10_2_ >> 1;
  auVar216._12_2_ = auVar215._12_2_ >> 1;
  auVar216._14_2_ = auVar215._14_2_ >> 1;
  auVar121 = paddusw(auVar216,auVar121);
  auVar121 = auVar121 ^ _DAT_004dab60;
  auVar199 = auVar199 ^ _DAT_004dab60;
  auVar217._0_2_ = -(ushort)(auVar199._0_2_ < auVar121._0_2_);
  auVar217._2_2_ = -(ushort)(auVar199._2_2_ < auVar121._2_2_);
  auVar217._4_2_ = -(ushort)(auVar199._4_2_ < auVar121._4_2_);
  auVar217._6_2_ = -(ushort)(auVar199._6_2_ < auVar121._6_2_);
  auVar217._8_2_ = -(ushort)(auVar199._8_2_ < auVar121._8_2_);
  auVar217._10_2_ = -(ushort)(auVar199._10_2_ < auVar121._10_2_);
  auVar217._12_2_ = -(ushort)(auVar199._12_2_ < auVar121._12_2_);
  auVar217._14_2_ = -(ushort)(auVar199._14_2_ < auVar121._14_2_);
  auVar121 = paddusw(auVar207,_DAT_005154e0);
  auVar121 = auVar121 & auVar217;
  sVar97 = auVar100._0_2_;
  sVar104 = auVar121._0_2_;
  uVar119 = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar100._2_2_;
  sVar104 = auVar121._2_2_;
  uVar124 = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar100._4_2_;
  sVar104 = auVar121._4_2_;
  uVar125 = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar100._6_2_;
  sVar104 = auVar121._6_2_;
  uVar127 = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar100._8_2_;
  sVar104 = auVar121._8_2_;
  uVar128 = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar100._10_2_;
  sVar104 = auVar121._10_2_;
  uVar129 = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar100._12_2_;
  sVar104 = auVar121._12_2_;
  sVar105 = auVar121._14_2_;
  uVar130 = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar100._14_2_;
  uVar131 = (ushort)(sVar105 < sVar97) * sVar97 | (ushort)(sVar105 >= sVar97) * sVar105;
  sVar97 = auVar169._0_2_;
  uVar167 = (sVar97 < (short)auVar186._0_2_) * auVar186._0_2_ |
            (ushort)(sVar97 >= (short)auVar186._0_2_) * sVar97;
  sVar97 = auVar169._2_2_;
  uVar172 = (sVar97 < (short)auVar186._2_2_) * auVar186._2_2_ |
            (ushort)(sVar97 >= (short)auVar186._2_2_) * sVar97;
  sVar97 = auVar169._4_2_;
  uVar173 = (sVar97 < (short)auVar186._4_2_) * auVar186._4_2_ |
            (ushort)(sVar97 >= (short)auVar186._4_2_) * sVar97;
  sVar97 = auVar169._6_2_;
  uVar174 = (sVar97 < (short)auVar186._6_2_) * auVar186._6_2_ |
            (ushort)(sVar97 >= (short)auVar186._6_2_) * sVar97;
  sVar97 = auVar169._8_2_;
  uVar176 = (sVar97 < (short)auVar186._8_2_) * auVar186._8_2_ |
            (ushort)(sVar97 >= (short)auVar186._8_2_) * sVar97;
  sVar97 = auVar169._10_2_;
  uVar178 = (sVar97 < (short)auVar186._10_2_) * auVar186._10_2_ |
            (ushort)(sVar97 >= (short)auVar186._10_2_) * sVar97;
  sVar97 = auVar169._12_2_;
  sVar104 = auVar169._14_2_;
  uVar179 = (sVar97 < (short)auVar186._12_2_) * auVar186._12_2_ |
            (ushort)(sVar97 >= (short)auVar186._12_2_) * sVar97;
  uVar180 = (sVar104 < (short)auVar186._14_2_) * auVar186._14_2_ |
            (ushort)(sVar104 >= (short)auVar186._14_2_) * sVar104;
  auVar170._0_2_ =
       ((short)uVar167 < (short)uVar119) * uVar119 | ((short)uVar167 >= (short)uVar119) * uVar167;
  auVar170._2_2_ =
       ((short)uVar172 < (short)uVar124) * uVar124 | ((short)uVar172 >= (short)uVar124) * uVar172;
  auVar170._4_2_ =
       ((short)uVar173 < (short)uVar125) * uVar125 | ((short)uVar173 >= (short)uVar125) * uVar173;
  auVar170._6_2_ =
       ((short)uVar174 < (short)uVar127) * uVar127 | ((short)uVar174 >= (short)uVar127) * uVar174;
  auVar170._8_2_ =
       ((short)uVar176 < (short)uVar128) * uVar128 | ((short)uVar176 >= (short)uVar128) * uVar176;
  auVar170._10_2_ =
       ((short)uVar178 < (short)uVar129) * uVar129 | ((short)uVar178 >= (short)uVar129) * uVar178;
  auVar170._12_2_ =
       ((short)uVar179 < (short)uVar130) * uVar130 | ((short)uVar179 >= (short)uVar130) * uVar179;
  auVar170._14_2_ =
       ((short)uVar180 < (short)uVar131) * uVar131 | ((short)uVar180 >= (short)uVar131) * uVar180;
  auVar170 = auVar170 ^ _DAT_004dab60;
  auVar207 = auVar207 ^ _DAT_004dab60;
  auVar171._0_2_ = -(ushort)(auVar207._0_2_ < auVar170._0_2_);
  auVar171._2_2_ = -(ushort)(auVar207._2_2_ < auVar170._2_2_);
  auVar171._4_2_ = -(ushort)(auVar207._4_2_ < auVar170._4_2_);
  auVar171._6_2_ = -(ushort)(auVar207._6_2_ < auVar170._6_2_);
  auVar171._8_2_ = -(ushort)(auVar207._8_2_ < auVar170._8_2_);
  auVar171._10_2_ = -(ushort)(auVar207._10_2_ < auVar170._10_2_);
  auVar171._12_2_ = -(ushort)(auVar207._12_2_ < auVar170._12_2_);
  auVar171._14_2_ = -(ushort)(auVar207._14_2_ < auVar170._14_2_);
  auVar145 = psllw(_DAT_005154e0,ZEXT416((uint)bd));
  auVar100 = psubusw(auVar162,auVar139);
  auVar121 = psubusw(auVar139,auVar162);
  auVar121 = auVar121 | auVar100;
  auVar100 = psubusw(auVar197,auVar208);
  auVar169 = psubusw(auVar208,auVar197);
  auVar169 = auVar169 | auVar100;
  auVar185 = psllw(auVar158,auVar184);
  sVar97 = auVar121._0_2_;
  sVar104 = auVar169._0_2_;
  uVar119 = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar121._2_2_;
  sVar104 = auVar169._2_2_;
  uVar124 = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar121._4_2_;
  sVar104 = auVar169._4_2_;
  uVar125 = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar121._6_2_;
  sVar104 = auVar169._6_2_;
  uVar127 = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar121._8_2_;
  sVar104 = auVar169._8_2_;
  uVar128 = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar121._10_2_;
  sVar104 = auVar169._10_2_;
  uVar129 = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar121._12_2_;
  sVar104 = auVar169._12_2_;
  sVar105 = auVar169._14_2_;
  uVar130 = (ushort)(sVar104 < sVar97) * sVar97 | (ushort)(sVar104 >= sVar97) * sVar104;
  sVar97 = auVar121._14_2_;
  uVar131 = (ushort)(sVar105 < sVar97) * sVar97 | (ushort)(sVar105 >= sVar97) * sVar105;
  auVar100 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar100 = pshuflw(auVar100,auVar100,0);
  uVar98 = auVar100._0_4_;
  auVar146._4_4_ = uVar98;
  auVar146._0_4_ = uVar98;
  auVar146._8_4_ = uVar98;
  auVar146._12_4_ = uVar98;
  auVar215 = psllw(_DAT_005154e0,auVar184);
  auVar100 = psubsw(auVar208,auVar146);
  auVar218._0_2_ =
       ((short)uVar119 < (short)auVar186._0_2_) * auVar186._0_2_ |
       ((short)uVar119 >= (short)auVar186._0_2_) * uVar119;
  auVar218._2_2_ =
       ((short)uVar124 < (short)auVar186._2_2_) * auVar186._2_2_ |
       ((short)uVar124 >= (short)auVar186._2_2_) * uVar124;
  auVar218._4_2_ =
       ((short)uVar125 < (short)auVar186._4_2_) * auVar186._4_2_ |
       ((short)uVar125 >= (short)auVar186._4_2_) * uVar125;
  auVar218._6_2_ =
       ((short)uVar127 < (short)auVar186._6_2_) * auVar186._6_2_ |
       ((short)uVar127 >= (short)auVar186._6_2_) * uVar127;
  auVar218._8_2_ =
       ((short)uVar128 < (short)auVar186._8_2_) * auVar186._8_2_ |
       ((short)uVar128 >= (short)auVar186._8_2_) * uVar128;
  auVar218._10_2_ =
       ((short)uVar129 < (short)auVar186._10_2_) * auVar186._10_2_ |
       ((short)uVar129 >= (short)auVar186._10_2_) * uVar129;
  auVar218._12_2_ =
       ((short)uVar130 < (short)auVar186._12_2_) * auVar186._12_2_ |
       ((short)uVar130 >= (short)auVar186._12_2_) * uVar130;
  auVar218._14_2_ =
       ((short)uVar131 < (short)auVar186._14_2_) * auVar186._14_2_ |
       ((short)uVar131 >= (short)auVar186._14_2_) * uVar131;
  auVar186 = auVar186 ^ _DAT_004dab60;
  auVar185 = auVar185 ^ _DAT_004dab60;
  auVar187._0_2_ = -(ushort)(auVar185._0_2_ < auVar186._0_2_);
  auVar187._2_2_ = -(ushort)(auVar185._2_2_ < auVar186._2_2_);
  auVar187._4_2_ = -(ushort)(auVar185._4_2_ < auVar186._4_2_);
  auVar187._6_2_ = -(ushort)(auVar185._6_2_ < auVar186._6_2_);
  auVar187._8_2_ = -(ushort)(auVar185._8_2_ < auVar186._8_2_);
  auVar187._10_2_ = -(ushort)(auVar185._10_2_ < auVar186._10_2_);
  auVar187._12_2_ = -(ushort)(auVar185._12_2_ < auVar186._12_2_);
  auVar187._14_2_ = -(ushort)(auVar185._14_2_ < auVar186._14_2_);
  auVar121 = psubsw(auVar163,auVar146);
  auVar169 = psubsw(auVar139,auVar146);
  auVar163 = psubsw(auVar144,auVar146);
  auVar184._8_4_ = 0xffffffff;
  auVar184._0_8_ = 0xffffffffffffffff;
  auVar184._12_4_ = 0xffffffff;
  auVar185 = paddsw(auVar145,auVar184);
  auVar208 = psubsw(auVar185,auVar146);
  auVar145 = psubsw((undefined1  [16])0x0,auVar146);
  auVar185 = psubsw(auVar121,auVar163);
  sVar143 = auVar208._0_2_;
  sVar97 = auVar185._0_2_;
  uVar119 = (ushort)(sVar143 < sVar97) * sVar143 | (ushort)(sVar143 >= sVar97) * sVar97;
  sVar147 = auVar208._2_2_;
  sVar97 = auVar185._2_2_;
  uVar124 = (ushort)(sVar147 < sVar97) * sVar147 | (ushort)(sVar147 >= sVar97) * sVar97;
  sVar148 = auVar208._4_2_;
  sVar97 = auVar185._4_2_;
  uVar125 = (ushort)(sVar148 < sVar97) * sVar148 | (ushort)(sVar148 >= sVar97) * sVar97;
  sVar149 = auVar208._6_2_;
  sVar97 = auVar185._6_2_;
  uVar127 = (ushort)(sVar149 < sVar97) * sVar149 | (ushort)(sVar149 >= sVar97) * sVar97;
  sVar150 = auVar208._8_2_;
  sVar97 = auVar185._8_2_;
  uVar128 = (ushort)(sVar150 < sVar97) * sVar150 | (ushort)(sVar150 >= sVar97) * sVar97;
  sVar151 = auVar208._10_2_;
  sVar97 = auVar185._10_2_;
  uVar129 = (ushort)(sVar151 < sVar97) * sVar151 | (ushort)(sVar151 >= sVar97) * sVar97;
  sVar152 = auVar208._12_2_;
  sVar97 = auVar185._12_2_;
  sVar104 = auVar185._14_2_;
  uVar130 = (ushort)(sVar152 < sVar97) * sVar152 | (ushort)(sVar152 >= sVar97) * sVar97;
  sVar153 = auVar208._14_2_;
  uVar131 = (ushort)(sVar153 < sVar104) * sVar153 | (ushort)(sVar153 >= sVar104) * sVar104;
  sVar97 = auVar145._0_2_;
  auVar199._0_2_ = (ushort)((short)uVar119 < sVar97) * sVar97 | ((short)uVar119 >= sVar97) * uVar119
  ;
  sVar104 = auVar145._2_2_;
  auVar199._2_2_ =
       (ushort)((short)uVar124 < sVar104) * sVar104 | ((short)uVar124 >= sVar104) * uVar124;
  sVar105 = auVar145._4_2_;
  auVar199._4_2_ =
       (ushort)((short)uVar125 < sVar105) * sVar105 | ((short)uVar125 >= sVar105) * uVar125;
  sVar106 = auVar145._6_2_;
  auVar199._6_2_ =
       (ushort)((short)uVar127 < sVar106) * sVar106 | ((short)uVar127 >= sVar106) * uVar127;
  sVar108 = auVar145._8_2_;
  auVar199._8_2_ =
       (ushort)((short)uVar128 < sVar108) * sVar108 | ((short)uVar128 >= sVar108) * uVar128;
  sVar110 = auVar145._10_2_;
  auVar199._10_2_ =
       (ushort)((short)uVar129 < sVar110) * sVar110 | ((short)uVar129 >= sVar110) * uVar129;
  sVar111 = auVar145._12_2_;
  auVar199._12_2_ =
       (ushort)((short)uVar130 < sVar111) * sVar111 | ((short)uVar130 >= sVar111) * uVar130;
  sVar112 = auVar145._14_2_;
  auVar199._14_2_ =
       (ushort)((short)uVar131 < sVar112) * sVar112 | ((short)uVar131 >= sVar112) * uVar131;
  auVar145 = psubsw(auVar169,auVar100);
  auVar185 = paddsw(auVar199 & auVar187,auVar145);
  auVar185 = paddsw(auVar185,auVar145);
  auVar185 = paddsw(auVar185,auVar145);
  sVar120 = auVar185._0_2_;
  uVar119 = (ushort)(sVar143 < sVar120) * sVar143 | (ushort)(sVar143 >= sVar120) * sVar120;
  sVar120 = auVar185._2_2_;
  uVar124 = (ushort)(sVar147 < sVar120) * sVar147 | (ushort)(sVar147 >= sVar120) * sVar120;
  sVar120 = auVar185._4_2_;
  uVar125 = (ushort)(sVar148 < sVar120) * sVar148 | (ushort)(sVar148 >= sVar120) * sVar120;
  sVar120 = auVar185._6_2_;
  uVar127 = (ushort)(sVar149 < sVar120) * sVar149 | (ushort)(sVar149 >= sVar120) * sVar120;
  sVar120 = auVar185._8_2_;
  uVar128 = (ushort)(sVar150 < sVar120) * sVar150 | (ushort)(sVar150 >= sVar120) * sVar120;
  sVar120 = auVar185._10_2_;
  uVar129 = (ushort)(sVar151 < sVar120) * sVar151 | (ushort)(sVar151 >= sVar120) * sVar120;
  sVar120 = auVar185._12_2_;
  sVar132 = auVar185._14_2_;
  uVar130 = (ushort)(sVar152 < sVar120) * sVar152 | (ushort)(sVar152 >= sVar120) * sVar120;
  uVar131 = (ushort)(sVar153 < sVar132) * sVar153 | (ushort)(sVar153 >= sVar132) * sVar132;
  auVar207._0_2_ = (ushort)((short)uVar119 < sVar97) * sVar97 | ((short)uVar119 >= sVar97) * uVar119
  ;
  auVar207._2_2_ =
       (ushort)((short)uVar124 < sVar104) * sVar104 | ((short)uVar124 >= sVar104) * uVar124;
  auVar207._4_2_ =
       (ushort)((short)uVar125 < sVar105) * sVar105 | ((short)uVar125 >= sVar105) * uVar125;
  auVar207._6_2_ =
       (ushort)((short)uVar127 < sVar106) * sVar106 | ((short)uVar127 >= sVar106) * uVar127;
  auVar207._8_2_ =
       (ushort)((short)uVar128 < sVar108) * sVar108 | ((short)uVar128 >= sVar108) * uVar128;
  auVar207._10_2_ =
       (ushort)((short)uVar129 < sVar110) * sVar110 | ((short)uVar129 >= sVar110) * uVar129;
  auVar207._12_2_ =
       (ushort)((short)uVar130 < sVar111) * sVar111 | ((short)uVar130 >= sVar111) * uVar130;
  auVar207._14_2_ =
       (ushort)((short)uVar131 < sVar112) * sVar112 | ((short)uVar131 >= sVar112) * uVar131;
  auVar218 = auVar218 ^ _DAT_004dab60;
  auVar215 = auVar215 ^ _DAT_004dab60;
  auVar219._0_2_ = -(ushort)(auVar215._0_2_ < auVar218._0_2_);
  auVar219._2_2_ = -(ushort)(auVar215._2_2_ < auVar218._2_2_);
  auVar219._4_2_ = -(ushort)(auVar215._4_2_ < auVar218._4_2_);
  auVar219._6_2_ = -(ushort)(auVar215._6_2_ < auVar218._6_2_);
  auVar219._8_2_ = -(ushort)(auVar215._8_2_ < auVar218._8_2_);
  auVar219._10_2_ = -(ushort)(auVar215._10_2_ < auVar218._10_2_);
  auVar219._12_2_ = -(ushort)(auVar215._12_2_ < auVar218._12_2_);
  auVar219._14_2_ = -(ushort)(auVar215._14_2_ < auVar218._14_2_);
  auVar185 = paddsw(_DAT_00509890,~auVar171 & auVar207);
  auVar145 = paddsw(~auVar171 & auVar207,_DAT_00515500);
  auVar219 = auVar219 | auVar171;
  sVar120 = auVar145._0_2_;
  uVar119 = (ushort)(sVar143 < sVar120) * sVar143 | (ushort)(sVar143 >= sVar120) * sVar120;
  sVar120 = auVar145._2_2_;
  uVar124 = (ushort)(sVar147 < sVar120) * sVar147 | (ushort)(sVar147 >= sVar120) * sVar120;
  sVar120 = auVar145._4_2_;
  uVar125 = (ushort)(sVar148 < sVar120) * sVar148 | (ushort)(sVar148 >= sVar120) * sVar120;
  sVar120 = auVar145._6_2_;
  uVar127 = (ushort)(sVar149 < sVar120) * sVar149 | (ushort)(sVar149 >= sVar120) * sVar120;
  sVar120 = auVar145._8_2_;
  uVar128 = (ushort)(sVar150 < sVar120) * sVar150 | (ushort)(sVar150 >= sVar120) * sVar120;
  sVar120 = auVar145._10_2_;
  uVar129 = (ushort)(sVar151 < sVar120) * sVar151 | (ushort)(sVar151 >= sVar120) * sVar120;
  sVar120 = auVar145._12_2_;
  sVar132 = auVar145._14_2_;
  uVar130 = (ushort)(sVar152 < sVar120) * sVar152 | (ushort)(sVar152 >= sVar120) * sVar120;
  uVar131 = (ushort)(sVar153 < sVar132) * sVar153 | (ushort)(sVar153 >= sVar132) * sVar132;
  auVar223._0_2_ = (ushort)((short)uVar119 < sVar97) * sVar97 | ((short)uVar119 >= sVar97) * uVar119
  ;
  auVar223._2_2_ =
       (ushort)((short)uVar124 < sVar104) * sVar104 | ((short)uVar124 >= sVar104) * uVar124;
  auVar223._4_2_ =
       (ushort)((short)uVar125 < sVar105) * sVar105 | ((short)uVar125 >= sVar105) * uVar125;
  auVar223._6_2_ =
       (ushort)((short)uVar127 < sVar106) * sVar106 | ((short)uVar127 >= sVar106) * uVar127;
  auVar223._8_2_ =
       (ushort)((short)uVar128 < sVar108) * sVar108 | ((short)uVar128 >= sVar108) * uVar128;
  auVar223._10_2_ =
       (ushort)((short)uVar129 < sVar110) * sVar110 | ((short)uVar129 >= sVar110) * uVar129;
  auVar223._12_2_ =
       (ushort)((short)uVar130 < sVar111) * sVar111 | ((short)uVar130 >= sVar111) * uVar130;
  auVar223._14_2_ =
       (ushort)((short)uVar131 < sVar112) * sVar112 | ((short)uVar131 >= sVar112) * uVar131;
  auVar145 = psraw(auVar223,3);
  auVar208 = paddsw(auVar145,auVar100);
  sVar120 = auVar185._0_2_;
  uVar119 = (ushort)(sVar143 < sVar120) * sVar143 | (ushort)(sVar143 >= sVar120) * sVar120;
  sVar120 = auVar185._2_2_;
  uVar124 = (ushort)(sVar147 < sVar120) * sVar147 | (ushort)(sVar147 >= sVar120) * sVar120;
  sVar120 = auVar185._4_2_;
  uVar125 = (ushort)(sVar148 < sVar120) * sVar148 | (ushort)(sVar148 >= sVar120) * sVar120;
  sVar120 = auVar185._6_2_;
  uVar127 = (ushort)(sVar149 < sVar120) * sVar149 | (ushort)(sVar149 >= sVar120) * sVar120;
  sVar120 = auVar185._8_2_;
  uVar128 = (ushort)(sVar150 < sVar120) * sVar150 | (ushort)(sVar150 >= sVar120) * sVar120;
  sVar120 = auVar185._10_2_;
  uVar129 = (ushort)(sVar151 < sVar120) * sVar151 | (ushort)(sVar151 >= sVar120) * sVar120;
  sVar120 = auVar185._12_2_;
  sVar132 = auVar185._14_2_;
  uVar130 = (ushort)(sVar152 < sVar120) * sVar152 | (ushort)(sVar152 >= sVar120) * sVar120;
  uVar131 = (ushort)(sVar153 < sVar132) * sVar153 | (ushort)(sVar153 >= sVar132) * sVar132;
  auVar100._0_2_ = (ushort)((short)uVar119 < sVar97) * sVar97 | ((short)uVar119 >= sVar97) * uVar119
  ;
  auVar100._2_2_ =
       (ushort)((short)uVar124 < sVar104) * sVar104 | ((short)uVar124 >= sVar104) * uVar124;
  auVar100._4_2_ =
       (ushort)((short)uVar125 < sVar105) * sVar105 | ((short)uVar125 >= sVar105) * uVar125;
  auVar100._6_2_ =
       (ushort)((short)uVar127 < sVar106) * sVar106 | ((short)uVar127 >= sVar106) * uVar127;
  auVar100._8_2_ =
       (ushort)((short)uVar128 < sVar108) * sVar108 | ((short)uVar128 >= sVar108) * uVar128;
  auVar100._10_2_ =
       (ushort)((short)uVar129 < sVar110) * sVar110 | ((short)uVar129 >= sVar110) * uVar129;
  auVar100._12_2_ =
       (ushort)((short)uVar130 < sVar111) * sVar111 | ((short)uVar130 >= sVar111) * uVar130;
  auVar100._14_2_ =
       (ushort)((short)uVar131 < sVar112) * sVar112 | ((short)uVar131 >= sVar112) * uVar131;
  auVar100 = psraw(auVar100,3);
  auVar185 = psubsw(auVar169,auVar100);
  auVar215._0_2_ = auVar100._0_2_ + 1;
  auVar215._2_2_ = auVar100._2_2_ + 1;
  auVar215._4_2_ = auVar100._4_2_ + 1;
  auVar215._6_2_ = auVar100._6_2_ + 1;
  auVar215._8_2_ = auVar100._8_2_ + 1;
  auVar215._10_2_ = auVar100._10_2_ + 1;
  auVar215._12_2_ = auVar100._12_2_ + 1;
  auVar215._14_2_ = auVar100._14_2_ + 1;
  auVar100 = psraw(auVar215,1);
  auVar145 = psubsw(auVar163,~auVar187 & auVar100);
  auVar100 = paddsw(~auVar187 & auVar100,auVar121);
  sVar120 = auVar185._0_2_;
  uVar119 = (ushort)(sVar143 < sVar120) * sVar143 | (ushort)(sVar143 >= sVar120) * sVar120;
  sVar120 = auVar185._2_2_;
  uVar124 = (ushort)(sVar147 < sVar120) * sVar147 | (ushort)(sVar147 >= sVar120) * sVar120;
  sVar120 = auVar185._4_2_;
  uVar125 = (ushort)(sVar148 < sVar120) * sVar148 | (ushort)(sVar148 >= sVar120) * sVar120;
  sVar120 = auVar185._6_2_;
  uVar127 = (ushort)(sVar149 < sVar120) * sVar149 | (ushort)(sVar149 >= sVar120) * sVar120;
  sVar120 = auVar185._8_2_;
  uVar128 = (ushort)(sVar150 < sVar120) * sVar150 | (ushort)(sVar150 >= sVar120) * sVar120;
  sVar120 = auVar185._10_2_;
  uVar129 = (ushort)(sVar151 < sVar120) * sVar151 | (ushort)(sVar151 >= sVar120) * sVar120;
  sVar120 = auVar185._12_2_;
  sVar132 = auVar185._14_2_;
  uVar130 = (ushort)(sVar152 < sVar120) * sVar152 | (ushort)(sVar152 >= sVar120) * sVar120;
  uVar131 = (ushort)(sVar153 < sVar132) * sVar153 | (ushort)(sVar153 >= sVar132) * sVar132;
  sVar120 = auVar208._0_2_;
  uVar222 = (ushort)(sVar143 < sVar120) * sVar143 | (ushort)(sVar143 >= sVar120) * sVar120;
  sVar120 = auVar208._2_2_;
  uVar225 = (ushort)(sVar147 < sVar120) * sVar147 | (ushort)(sVar147 >= sVar120) * sVar120;
  sVar120 = auVar208._4_2_;
  uVar226 = (ushort)(sVar148 < sVar120) * sVar148 | (ushort)(sVar148 >= sVar120) * sVar120;
  sVar120 = auVar208._6_2_;
  uVar227 = (ushort)(sVar149 < sVar120) * sVar149 | (ushort)(sVar149 >= sVar120) * sVar120;
  sVar120 = auVar208._8_2_;
  uVar228 = (ushort)(sVar150 < sVar120) * sVar150 | (ushort)(sVar150 >= sVar120) * sVar120;
  sVar120 = auVar208._10_2_;
  uVar229 = (ushort)(sVar151 < sVar120) * sVar151 | (ushort)(sVar151 >= sVar120) * sVar120;
  sVar120 = auVar208._12_2_;
  sVar132 = auVar208._14_2_;
  uVar230 = (ushort)(sVar152 < sVar120) * sVar152 | (ushort)(sVar152 >= sVar120) * sVar120;
  uVar231 = (ushort)(sVar153 < sVar132) * sVar153 | (ushort)(sVar153 >= sVar132) * sVar132;
  sVar120 = auVar145._0_2_;
  uVar167 = (ushort)(sVar143 < sVar120) * sVar143 | (ushort)(sVar143 >= sVar120) * sVar120;
  sVar120 = auVar145._2_2_;
  uVar172 = (ushort)(sVar147 < sVar120) * sVar147 | (ushort)(sVar147 >= sVar120) * sVar120;
  sVar120 = auVar145._4_2_;
  uVar173 = (ushort)(sVar148 < sVar120) * sVar148 | (ushort)(sVar148 >= sVar120) * sVar120;
  sVar120 = auVar145._6_2_;
  uVar174 = (ushort)(sVar149 < sVar120) * sVar149 | (ushort)(sVar149 >= sVar120) * sVar120;
  sVar120 = auVar145._8_2_;
  uVar176 = (ushort)(sVar150 < sVar120) * sVar150 | (ushort)(sVar150 >= sVar120) * sVar120;
  sVar120 = auVar145._10_2_;
  uVar178 = (ushort)(sVar151 < sVar120) * sVar151 | (ushort)(sVar151 >= sVar120) * sVar120;
  sVar120 = auVar145._12_2_;
  sVar132 = auVar145._14_2_;
  uVar179 = (ushort)(sVar152 < sVar120) * sVar152 | (ushort)(sVar152 >= sVar120) * sVar120;
  uVar180 = (ushort)(sVar153 < sVar132) * sVar153 | (ushort)(sVar153 >= sVar132) * sVar132;
  sVar120 = auVar100._0_2_;
  uVar181 = (ushort)(sVar143 < sVar120) * sVar143 | (ushort)(sVar143 >= sVar120) * sVar120;
  sVar143 = auVar100._2_2_;
  uVar190 = (ushort)(sVar147 < sVar143) * sVar147 | (ushort)(sVar147 >= sVar143) * sVar143;
  sVar143 = auVar100._4_2_;
  uVar191 = (ushort)(sVar148 < sVar143) * sVar148 | (ushort)(sVar148 >= sVar143) * sVar143;
  sVar143 = auVar100._6_2_;
  uVar192 = (ushort)(sVar149 < sVar143) * sVar149 | (ushort)(sVar149 >= sVar143) * sVar143;
  sVar143 = auVar100._8_2_;
  uVar193 = (ushort)(sVar150 < sVar143) * sVar150 | (ushort)(sVar150 >= sVar143) * sVar143;
  sVar143 = auVar100._10_2_;
  uVar194 = (ushort)(sVar151 < sVar143) * sVar151 | (ushort)(sVar151 >= sVar143) * sVar143;
  sVar143 = auVar100._12_2_;
  sVar147 = auVar100._14_2_;
  uVar195 = (ushort)(sVar152 < sVar143) * sVar152 | (ushort)(sVar152 >= sVar143) * sVar143;
  uVar196 = (ushort)(sVar153 < sVar147) * sVar153 | (ushort)(sVar153 >= sVar147) * sVar147;
  auVar159._0_2_ = (ushort)((short)uVar119 < sVar97) * sVar97 | ((short)uVar119 >= sVar97) * uVar119
  ;
  auVar159._2_2_ =
       (ushort)((short)uVar124 < sVar104) * sVar104 | ((short)uVar124 >= sVar104) * uVar124;
  auVar159._4_2_ =
       (ushort)((short)uVar125 < sVar105) * sVar105 | ((short)uVar125 >= sVar105) * uVar125;
  auVar159._6_2_ =
       (ushort)((short)uVar127 < sVar106) * sVar106 | ((short)uVar127 >= sVar106) * uVar127;
  auVar159._8_2_ =
       (ushort)((short)uVar128 < sVar108) * sVar108 | ((short)uVar128 >= sVar108) * uVar128;
  auVar159._10_2_ =
       (ushort)((short)uVar129 < sVar110) * sVar110 | ((short)uVar129 >= sVar110) * uVar129;
  auVar159._12_2_ =
       (ushort)((short)uVar130 < sVar111) * sVar111 | ((short)uVar130 >= sVar111) * uVar130;
  auVar159._14_2_ =
       (ushort)((short)uVar131 < sVar112) * sVar112 | ((short)uVar131 >= sVar112) * uVar131;
  auVar224._0_2_ = (ushort)((short)uVar222 < sVar97) * sVar97 | ((short)uVar222 >= sVar97) * uVar222
  ;
  auVar224._2_2_ =
       (ushort)((short)uVar225 < sVar104) * sVar104 | ((short)uVar225 >= sVar104) * uVar225;
  auVar224._4_2_ =
       (ushort)((short)uVar226 < sVar105) * sVar105 | ((short)uVar226 >= sVar105) * uVar226;
  auVar224._6_2_ =
       (ushort)((short)uVar227 < sVar106) * sVar106 | ((short)uVar227 >= sVar106) * uVar227;
  auVar224._8_2_ =
       (ushort)((short)uVar228 < sVar108) * sVar108 | ((short)uVar228 >= sVar108) * uVar228;
  auVar224._10_2_ =
       (ushort)((short)uVar229 < sVar110) * sVar110 | ((short)uVar229 >= sVar110) * uVar229;
  auVar224._12_2_ =
       (ushort)((short)uVar230 < sVar111) * sVar111 | ((short)uVar230 >= sVar111) * uVar230;
  auVar224._14_2_ =
       (ushort)((short)uVar231 < sVar112) * sVar112 | ((short)uVar231 >= sVar112) * uVar231;
  auVar164._0_2_ = (ushort)((short)uVar167 < sVar97) * sVar97 | ((short)uVar167 >= sVar97) * uVar167
  ;
  auVar164._2_2_ =
       (ushort)((short)uVar172 < sVar104) * sVar104 | ((short)uVar172 >= sVar104) * uVar172;
  auVar164._4_2_ =
       (ushort)((short)uVar173 < sVar105) * sVar105 | ((short)uVar173 >= sVar105) * uVar173;
  auVar164._6_2_ =
       (ushort)((short)uVar174 < sVar106) * sVar106 | ((short)uVar174 >= sVar106) * uVar174;
  auVar164._8_2_ =
       (ushort)((short)uVar176 < sVar108) * sVar108 | ((short)uVar176 >= sVar108) * uVar176;
  auVar164._10_2_ =
       (ushort)((short)uVar178 < sVar110) * sVar110 | ((short)uVar178 >= sVar110) * uVar178;
  auVar164._12_2_ =
       (ushort)((short)uVar179 < sVar111) * sVar111 | ((short)uVar179 >= sVar111) * uVar179;
  auVar164._14_2_ =
       (ushort)((short)uVar180 < sVar112) * sVar112 | ((short)uVar180 >= sVar112) * uVar180;
  auVar188._0_2_ = (ushort)((short)uVar181 < sVar97) * sVar97 | ((short)uVar181 >= sVar97) * uVar181
  ;
  auVar188._2_2_ =
       (ushort)((short)uVar190 < sVar104) * sVar104 | ((short)uVar190 >= sVar104) * uVar190;
  auVar188._4_2_ =
       (ushort)((short)uVar191 < sVar105) * sVar105 | ((short)uVar191 >= sVar105) * uVar191;
  auVar188._6_2_ =
       (ushort)((short)uVar192 < sVar106) * sVar106 | ((short)uVar192 >= sVar106) * uVar192;
  auVar188._8_2_ =
       (ushort)((short)uVar193 < sVar108) * sVar108 | ((short)uVar193 >= sVar108) * uVar193;
  auVar188._10_2_ =
       (ushort)((short)uVar194 < sVar110) * sVar110 | ((short)uVar194 >= sVar110) * uVar194;
  auVar188._12_2_ =
       (ushort)((short)uVar195 < sVar111) * sVar111 | ((short)uVar195 >= sVar111) * uVar195;
  auVar188._14_2_ =
       (ushort)((short)uVar196 < sVar112) * sVar112 | ((short)uVar196 >= sVar112) * uVar196;
  auVar100 = paddsw(auVar159,auVar146);
  auVar145 = paddsw(auVar224,auVar146);
  auVar121 = paddsw(auVar164,auVar146);
  auVar185 = paddsw(auVar188,auVar146);
  if ((ushort)((ushort)(SUB161(auVar219 >> 7,0) & 1) | (ushort)(SUB161(auVar219 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar219 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar219 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar219 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar219 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar219 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar219 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar219 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar219 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar219 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar219 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar219 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar219 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar219 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar219[0xf] >> 7) << 0xf) != 0xffff) {
    sVar143 = auVar113._4_2_ + sVar141;
    sVar147 = puVar1[2] + uVar54;
    sVar148 = auVar117._4_2_ + sVar123;
    sVar149 = puVar2[2] + uVar59;
    sVar150 = auVar122._4_2_ + sVar209;
    sVar151 = puVar3[2] + uVar64;
    sVar152 = auVar140._4_2_ + sVar220;
    sVar153 = puVar4[2] + uVar69;
    sVar97 = sVar143 * 2 + sVar133 + 4;
    sVar104 = sVar147 * 2 + uVar53 + 4;
    sVar105 = sVar148 * 2 + sVar118 + 4;
    sVar106 = sVar149 * 2 + uVar58 + 4;
    sVar108 = sVar150 * 2 + sVar200 + 4;
    sVar110 = sVar151 * 2 + uVar63 + 4;
    sVar111 = sVar152 * 2 + sVar211 + 4;
    sVar112 = sVar153 * 2 + uVar68 + 4;
    auVar122._0_2_ = (ushort)(sVar133 * 2 + sVar142 + sVar97) >> 3;
    auVar122._2_2_ = (ushort)(uVar53 * 2 + uVar55 + sVar104) >> 3;
    auVar122._4_2_ = (ushort)(sVar118 * 2 + sVar126 + sVar105) >> 3;
    auVar122._6_2_ = (ushort)(uVar58 * 2 + uVar60 + sVar106) >> 3;
    auVar122._8_2_ = (ushort)(sVar200 * 2 + sVar210 + sVar108) >> 3;
    auVar122._10_2_ = (ushort)(uVar63 * 2 + uVar65 + sVar110) >> 3;
    auVar122._12_2_ = (ushort)(sVar211 * 2 + sVar221 + sVar111) >> 3;
    auVar122._14_2_ = (ushort)(uVar68 * 2 + uVar70 + sVar112) >> 3;
    uVar167 = sVar142 * 2 + sVar165 + sVar97;
    uVar172 = uVar55 * 2 + uVar56 + sVar104;
    uVar173 = sVar126 * 2 + sVar154 + sVar105;
    uVar174 = uVar60 * 2 + uVar61 + sVar106;
    uVar176 = sVar210 * 2 + sVar175 + sVar108;
    uVar178 = uVar65 * 2 + uVar66 + sVar110;
    uVar179 = sVar221 * 2 + sVar107 + sVar111;
    uVar180 = uVar70 * 2 + uVar71 + sVar112;
    uVar119 = ((sVar165 + sVar166) - (sVar141 + sVar133)) + uVar167;
    uVar124 = ((uVar56 + uVar57) - (uVar54 + uVar53)) + uVar172;
    uVar125 = ((sVar154 + sVar155) - (sVar123 + sVar118)) + uVar173;
    uVar127 = ((uVar61 + uVar62) - (uVar59 + uVar58)) + uVar174;
    uVar128 = ((sVar175 + sVar177) - (sVar209 + sVar200)) + uVar176;
    uVar129 = ((uVar66 + uVar67) - (uVar64 + uVar63)) + uVar178;
    uVar130 = ((sVar107 + sVar109) - (sVar220 + sVar211)) + uVar179;
    uVar131 = ((uVar71 + uVar72) - (uVar69 + uVar68)) + uVar180;
    auVar140._0_2_ = uVar167 >> 3;
    auVar140._2_2_ = uVar172 >> 3;
    auVar140._4_2_ = uVar173 >> 3;
    auVar140._6_2_ = uVar174 >> 3;
    auVar140._8_2_ = uVar176 >> 3;
    auVar140._10_2_ = uVar178 >> 3;
    auVar140._12_2_ = uVar179 >> 3;
    auVar140._14_2_ = uVar180 >> 3;
    auVar113._0_2_ = uVar119 >> 3;
    auVar113._2_2_ = uVar124 >> 3;
    auVar113._4_2_ = uVar125 >> 3;
    auVar113._6_2_ = uVar127 >> 3;
    auVar113._8_2_ = uVar128 >> 3;
    auVar113._10_2_ = uVar129 >> 3;
    auVar113._12_2_ = uVar130 >> 3;
    auVar113._14_2_ = uVar131 >> 3;
    auVar117._0_2_ = (ushort)((sVar166 * 2 - sVar143) + uVar119) >> 3;
    auVar117._2_2_ = (ushort)((uVar57 * 2 - sVar147) + uVar124) >> 3;
    auVar117._4_2_ = (ushort)((sVar155 * 2 - sVar148) + uVar125) >> 3;
    auVar117._6_2_ = (ushort)((uVar62 * 2 - sVar149) + uVar127) >> 3;
    auVar117._8_2_ = (ushort)((sVar177 * 2 - sVar150) + uVar128) >> 3;
    auVar117._10_2_ = (ushort)((uVar67 * 2 - sVar151) + uVar129) >> 3;
    auVar117._12_2_ = (ushort)((sVar109 * 2 - sVar152) + uVar130) >> 3;
    auVar117._14_2_ = (ushort)((uVar72 * 2 - sVar153) + uVar131) >> 3;
    auVar121 = auVar121 & auVar219 | ~auVar219 & auVar117;
    auVar185 = auVar185 & auVar219 | ~auVar219 & auVar122;
    auVar145 = auVar145 & auVar219 | ~auVar219 & auVar140;
    auVar100 = auVar100 & auVar219 | ~auVar219 & auVar113;
  }
  auVar103._0_12_ = auVar185._0_12_;
  auVar103._12_2_ = auVar185._6_2_;
  auVar103._14_2_ = auVar145._6_2_;
  auVar102._12_4_ = auVar103._12_4_;
  auVar102._0_10_ = auVar185._0_10_;
  auVar102._10_2_ = auVar145._4_2_;
  auVar101._10_6_ = auVar102._10_6_;
  auVar101._0_8_ = auVar185._0_8_;
  auVar101._8_2_ = auVar185._4_2_;
  auVar83._4_8_ = auVar101._8_8_;
  auVar83._2_2_ = auVar145._2_2_;
  auVar83._0_2_ = auVar185._2_2_;
  auVar116._0_12_ = auVar100._0_12_;
  auVar116._12_2_ = auVar100._6_2_;
  auVar116._14_2_ = auVar121._6_2_;
  auVar115._12_4_ = auVar116._12_4_;
  auVar115._0_10_ = auVar100._0_10_;
  auVar115._10_2_ = auVar121._4_2_;
  auVar114._10_6_ = auVar115._10_6_;
  auVar114._0_8_ = auVar100._0_8_;
  auVar114._8_2_ = auVar100._4_2_;
  auVar84._4_8_ = auVar114._8_8_;
  auVar84._2_2_ = auVar121._2_2_;
  auVar84._0_2_ = auVar100._2_2_;
  uVar182 = CONCAT22(auVar145._8_2_,auVar185._8_2_);
  auVar183._0_8_ = CONCAT26(auVar145._10_2_,CONCAT24(auVar185._10_2_,uVar182));
  auVar183._8_2_ = auVar185._12_2_;
  auVar183._10_2_ = auVar145._12_2_;
  auVar189._12_2_ = auVar185._14_2_;
  auVar189._0_12_ = auVar183;
  auVar189._14_2_ = auVar145._14_2_;
  uVar98 = CONCAT22(auVar121._8_2_,auVar100._8_2_);
  auVar156._0_8_ = CONCAT26(auVar121._10_2_,CONCAT24(auVar100._10_2_,uVar98));
  auVar156._8_2_ = auVar100._12_2_;
  auVar156._10_2_ = auVar121._12_2_;
  auVar160._12_2_ = auVar100._14_2_;
  auVar160._0_12_ = auVar156;
  auVar160._14_2_ = auVar121._14_2_;
  *(ulong *)(s + -2) =
       CONCAT44(CONCAT22(auVar121._0_2_,auVar100._0_2_),CONCAT22(auVar145._0_2_,auVar185._0_2_));
  *(ulong *)(s + (long)p + -2) = CONCAT44(auVar84._0_4_,auVar83._0_4_);
  *(ulong *)(s + (long)(p * 2) + -2) = CONCAT44(auVar114._8_4_,auVar101._8_4_);
  uVar99 = CONCAT44(auVar115._12_4_,auVar102._12_4_);
  *(undefined8 *)(s + (long)(p * 3) + -2) = uVar99;
  *(ulong *)(s + (long)(p * 4) + -2) = CONCAT44(uVar98,uVar182);
  *(ulong *)(s + (long)(p * 5) + -2) =
       CONCAT44((int)((ulong)auVar156._0_8_ >> 0x20),(int)((ulong)auVar183._0_8_ >> 0x20));
  *(ulong *)(s + (long)(p * 6) + -2) = CONCAT44(auVar156._8_4_,auVar183._8_4_);
  *(ulong *)(s + (long)(p * 7) + -2) = CONCAT44(auVar160._12_4_,auVar189._12_4_);
  return;
}

Assistant:

void aom_highbd_lpf_vertical_6_dual_sse2(
    uint16_t *s, int p, const uint8_t *_blimit0, const uint8_t *_limit0,
    const uint8_t *_thresh0, const uint8_t *_blimit1, const uint8_t *_limit1,
    const uint8_t *_thresh1, int bd) {
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;
  __m128i x0, x1, x2, x3, x4, x5, x6, x7;
  __m128i p0, q0, p1, q1, p2, q2;

  x0 = _mm_loadu_si128((__m128i *)((s - 3) + 0 * p));
  x1 = _mm_loadu_si128((__m128i *)((s - 3) + 1 * p));
  x2 = _mm_loadu_si128((__m128i *)((s - 3) + 2 * p));
  x3 = _mm_loadu_si128((__m128i *)((s - 3) + 3 * p));
  x4 = _mm_loadu_si128((__m128i *)((s - 3) + 4 * p));
  x5 = _mm_loadu_si128((__m128i *)((s - 3) + 5 * p));
  x6 = _mm_loadu_si128((__m128i *)((s - 3) + 6 * p));
  x7 = _mm_loadu_si128((__m128i *)((s - 3) + 7 * p));

  highbd_transpose8x8_sse2(&x0, &x1, &x2, &x3, &x4, &x5, &x6, &x7, &p2, &p1,
                           &p0, &q0, &q1, &q2, &d6, &d7);

  highbd_lpf_internal_6_dual_sse2(&p2, &p1, &p0, &q0, &q1, &q2, _blimit0,
                                  _limit0, _thresh0, _blimit1, _limit1,
                                  _thresh1, bd);

  highbd_transpose4x8_8x4_sse2(&p1, &p0, &q0, &q1, &d0, &d1, &d2, &d3, &d4, &d5,
                               &d6, &d7);

  _mm_storel_epi64((__m128i *)(s - 2 + 0 * p), d0);
  _mm_storel_epi64((__m128i *)(s - 2 + 1 * p), d1);
  _mm_storel_epi64((__m128i *)(s - 2 + 2 * p), d2);
  _mm_storel_epi64((__m128i *)(s - 2 + 3 * p), d3);
  _mm_storel_epi64((__m128i *)(s - 2 + 4 * p), d4);
  _mm_storel_epi64((__m128i *)(s - 2 + 5 * p), d5);
  _mm_storel_epi64((__m128i *)(s - 2 + 6 * p), d6);
  _mm_storel_epi64((__m128i *)(s - 2 + 7 * p), d7);
}